

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<Data>(PromiseError *this,Data_conflict *value)

{
  Data *this_00;
  Data_conflict *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  this_00 = (Data *)__cxa_allocate_exception(4);
  Data::Data(this_00,value);
  __cxa_throw(this_00,&Data::typeinfo,Data::~Data);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }